

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NewArrayExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NewArrayExpressionSyntax,slang::syntax::NewArrayExpressionSyntax_const&>
          (BumpAllocator *this,NewArrayExpressionSyntax *args)

{
  undefined4 uVar1;
  NewArrayExpressionSyntax *pNVar2;
  long lVar3;
  NewArrayExpressionSyntax *pNVar4;
  byte bVar5;
  
  bVar5 = 0;
  pNVar2 = (NewArrayExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NewArrayExpressionSyntax *)this->endPtr < pNVar2 + 1) {
    pNVar2 = (NewArrayExpressionSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pNVar2 + 1);
  }
  pNVar4 = pNVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
    (pNVar4->super_ExpressionSyntax).super_SyntaxNode.kind =
         (args->super_ExpressionSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pNVar4->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (NewArrayExpressionSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pNVar4 = (NewArrayExpressionSyntax *)((long)pNVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pNVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }